

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult vmaAllocateMemory(VmaAllocator allocator,VkMemoryRequirements *pVkMemoryRequirements,
                          VmaAllocationCreateInfo *pCreateInfo,VmaAllocation *pAllocation,
                          VmaAllocationInfo *pAllocationInfo)

{
  VkResult VVar1;
  VmaAllocator_T *in_RDX;
  long in_R8;
  VkResult result;
  VkImage in_stack_00000088;
  VkBuffer in_stack_00000090;
  bool in_stack_0000009e;
  bool in_stack_0000009f;
  VkMemoryRequirements *in_stack_000000a0;
  VmaAllocator_T *in_stack_000000a8;
  VkFlags in_stack_000000f0;
  VmaAllocationCreateInfo *in_stack_000000f8;
  VmaSuballocationType in_stack_00000100;
  size_t in_stack_00000108;
  VmaAllocation *in_stack_00000110;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffac;
  
  uVar2 = 0xffffffff;
  VVar1 = VmaAllocator_T::AllocateMemory
                    (in_stack_000000a8,in_stack_000000a0,in_stack_0000009f,in_stack_0000009e,
                     in_stack_00000090,in_stack_00000088,in_stack_000000f0,in_stack_000000f8,
                     in_stack_00000100,in_stack_00000108,in_stack_00000110);
  if ((in_R8 != 0) && (VVar1 == VK_SUCCESS)) {
    VmaAllocator_T::GetAllocationInfo
              (in_RDX,(VmaAllocation)CONCAT44(in_stack_ffffffffffffffac,uVar2),
               (VmaAllocationInfo *)0x3028ce);
  }
  return VVar1;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaAllocateMemory(
    VmaAllocator allocator,
    const VkMemoryRequirements* pVkMemoryRequirements,
    const VmaAllocationCreateInfo* pCreateInfo,
    VmaAllocation* pAllocation,
    VmaAllocationInfo* pAllocationInfo)
{
    VMA_ASSERT(allocator && pVkMemoryRequirements && pCreateInfo && pAllocation);

    VMA_DEBUG_LOG("vmaAllocateMemory");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    VkResult result = allocator->AllocateMemory(
        *pVkMemoryRequirements,
        false, // requiresDedicatedAllocation
        false, // prefersDedicatedAllocation
        VK_NULL_HANDLE, // dedicatedBuffer
        VK_NULL_HANDLE, // dedicatedImage
        UINT32_MAX, // dedicatedBufferImageUsage
        *pCreateInfo,
        VMA_SUBALLOCATION_TYPE_UNKNOWN,
        1, // allocationCount
        pAllocation);

    if(pAllocationInfo != VMA_NULL && result == VK_SUCCESS)
    {
        allocator->GetAllocationInfo(*pAllocation, pAllocationInfo);
    }

    return result;
}